

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void RenderArrowsForVerticalBar
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w,float alpha)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImVec2 half_sz_00;
  ImVec2 half_sz_01;
  ImVec2 half_sz_02;
  ImVec2 half_sz_03;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 pos_03;
  float fVar3;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  float in_XMM2_Da;
  float in_XMM3_Da;
  ImU32 alpha8;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  undefined8 local_48;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  ImDrawList *in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd8;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar2 = vmovlpd_avx(in_ZMM1._0_16_);
  fVar3 = ImSaturate(in_XMM3_Da);
  fVar3 = (float)(int)(fVar3 * 255.0 + 0.5);
  local_10 = (float)uVar2;
  local_8 = (float)uVar1;
  fStack_4 = (float)((ulong)uVar1 >> 0x20);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd4,local_8 + local_10 + 1.0,fStack_4);
  fStack_c = (float)((ulong)uVar2 >> 0x20);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,local_10 + 2.0,fStack_c + 1.0);
  pos_00.y = in_XMM2_Da;
  pos_00.x = in_XMM3_Da;
  half_sz_00.y = fVar3;
  half_sz_00.x = in_stack_ffffffffffffffd8;
  ImGui::RenderArrowPointingAt
            (in_stack_ffffffffffffffd0,pos_00,half_sz_00,(ImGuiDir)in_stack_ffffffffffffffcc,
             (ImU32)in_stack_ffffffffffffffc8);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,local_8 + local_10,fStack_4);
  pos_01.y = in_XMM2_Da;
  pos_01.x = in_XMM3_Da;
  half_sz_01.y = fVar3;
  half_sz_01.x = in_stack_ffffffffffffffd8;
  local_48 = uVar2;
  ImGui::RenderArrowPointingAt
            (in_stack_ffffffffffffffd0,pos_01,half_sz_01,(ImGuiDir)in_stack_ffffffffffffffcc,
             (ImU32)in_stack_ffffffffffffffc8);
  ImVec2::ImVec2(&local_50,((local_8 + in_XMM2_Da) - local_10) - 1.0,fStack_4);
  ImVec2::ImVec2(&local_58,local_10 + 2.0,fStack_c + 1.0);
  pos_02.y = in_XMM2_Da;
  pos_02.x = in_XMM3_Da;
  half_sz_02.y = fVar3;
  half_sz_02.x = in_stack_ffffffffffffffd8;
  ImGui::RenderArrowPointingAt
            (in_stack_ffffffffffffffd0,pos_02,half_sz_02,(ImGuiDir)in_stack_ffffffffffffffcc,
             (ImU32)in_stack_ffffffffffffffc8);
  ImVec2::ImVec2(&local_60,(local_8 + in_XMM2_Da) - local_10,fStack_4);
  pos_03.y = in_XMM2_Da;
  pos_03.x = in_XMM3_Da;
  half_sz_03.y = fVar3;
  half_sz_03.x = in_stack_ffffffffffffffd8;
  ImGui::RenderArrowPointingAt
            (in_stack_ffffffffffffffd0,pos_03,half_sz_03,(ImGuiDir)in_stack_ffffffffffffffcc,
             (ImU32)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w, float alpha)
{
    ImU32 alpha8 = IM_F32_TO_INT8_SAT(alpha);
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32(255,255,255,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32(255,255,255,alpha8));
}